

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O2

int * __thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::operator[]
          (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this,int *key)

{
  pointer pvVar1;
  ValueIterator VVar2;
  ulong uVar3;
  size_t bucketIdx;
  ValueT local_20;
  
  pvVar1 = (this->mBuckets).
           super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (ulong)(long)*key %
          (ulong)(((long)(this->mBuckets).
                         super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18);
  bucketIdx = uVar3;
  VVar2 = find_in_bucket(this,pvVar1 + uVar3,key);
  if (VVar2._M_current ==
      *(pointer *)
       ((long)&(this->mBuckets).
               super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar3].
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl + 8)) {
    local_20.second = 0;
    local_20.first = *key;
    VVar2 = insert_to_bucket(this,&local_20,&bucketIdx);
  }
  return &(VVar2._M_current)->second;
}

Assistant:

MappedT& operator[](const KeyT& key) {
      size_t bucketIdx = hash_to_bucket(key);
      ValueIterator it = find_in_bucket(mBuckets[bucketIdx],key);
      if (it == mBuckets[bucketIdx].end()) { // if not found, insert the new one
        it = insert_to_bucket(std::make_pair(key, MappedT()),bucketIdx);
      }
      return it->second;
    }